

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void pbrt::SetSearchDirectory(string *filename)

{
  bool bVar1;
  path path;
  path local_58;
  path local_30;
  
  filesystem::path::path(&local_58,filename);
  bVar1 = filesystem::path::is_directory(&local_58);
  if (!bVar1) {
    filesystem::path::parent_path(&local_30,&local_58);
    filesystem::path::operator=(&local_58,&local_30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_30.m_path);
  }
  searchDirectory._0_4_ = local_58.m_type;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(searchDirectory + 8),&local_58.m_path);
  searchDirectory[0x20] = local_58.m_absolute;
  searchDirectory[0x21] = local_58.m_smb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.m_path);
  return;
}

Assistant:

void SetSearchDirectory(const std::string &filename) {
    filesystem::path path(filename);
    if (!path.is_directory())
        path = path.parent_path();
    searchDirectory = path;
}